

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Args::run(Args *this)

{
  string *__source;
  bool bVar1;
  DynamicFormat *pDVar2;
  long lVar3;
  path *__p;
  runtime_error *this_00;
  recursive_directory_iterator __end1;
  recursive_directory_iterator local_1d8;
  Args *local_1c8;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_1c0;
  string_view extension;
  path path;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_178;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_160;
  Args local_150;
  path local_58;
  
  if (this->recursive == false) {
    run_once(this);
    return;
  }
  __source = &this->input_dir;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&local_150,__source,auto_format);
  bVar1 = std::filesystem::exists((path *)&local_150);
  if (bVar1) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&path,__source,auto_format);
    bVar1 = std::filesystem::is_directory(&path);
    std::filesystem::__cxx11::path::~path(&path);
    std::filesystem::__cxx11::path::~path((path *)&local_150);
    if (bVar1) {
      if ((this->input_format)._M_string_length == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Recursive run needs input format!");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"",(allocator<char> *)&path);
        pDVar2 = get_format(&this->input_format,(string_view)(ZEXT816(0x138b44) << 0x40),
                            (string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        extension = (string_view)(**(code **)(*(long *)pDVar2 + 0x10))(pDVar2);
        lVar3 = (**(code **)(*(long *)pDVar2 + 0x10))(pDVar2);
        if (lVar3 != 0) {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    ((path *)&local_150,__source,auto_format);
          std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
                    ((recursive_directory_iterator *)&local_1c0,(path *)&local_150);
          std::filesystem::__cxx11::path::~path((path *)&local_150);
          std::
          __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_178,&local_1c0);
          local_1d8._M_dirs._M_ptr = local_178._M_ptr;
          local_1d8._M_dirs._M_refcount._M_pi = local_178._M_refcount._M_pi;
          local_178._M_ptr = (element_type *)0x0;
          local_178._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                    ((recursive_directory_iterator *)&local_178);
          std::
          __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_160,&local_1c0);
          __end1._M_dirs._M_ptr = (element_type *)0x0;
          __end1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                    ((recursive_directory_iterator *)&local_160);
          local_1c8 = this;
          while (local_1d8._M_dirs._M_refcount._M_pi != __end1._M_dirs._M_refcount._M_pi) {
            __p = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                    (&local_1d8);
            bVar1 = std::filesystem::__cxx11::directory_entry::is_regular_file
                              ((directory_entry *)__p);
            if (bVar1) {
              std::filesystem::__cxx11::path::path(&path,__p);
              std::filesystem::__cxx11::path::extension((path *)&local_150,&path);
              std::filesystem::__cxx11::path::
              path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                        (&local_58,&extension,auto_format);
              bVar1 = std::filesystem::__cxx11::operator==((path *)&local_150,&local_58);
              std::filesystem::__cxx11::path::~path(&local_58);
              std::filesystem::__cxx11::path::~path((path *)&local_150);
              if (bVar1) {
                std::filesystem::__cxx11::path::generic_string((string *)&local_150,&path);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&this->input_file,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_150);
                std::__cxx11::string::~string((string *)&local_150);
                Args(&local_150,local_1c8);
                run_once(&local_150);
                ~Args(&local_150);
              }
              std::filesystem::__cxx11::path::~path(&path);
            }
            std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_1d8);
          }
          std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                    (&__end1);
          std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                    (&local_1d8);
          std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                    ((recursive_directory_iterator *)&local_1c0);
          return;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Format must have default extension!");
      }
      goto LAB_00109733;
    }
  }
  else {
    std::filesystem::__cxx11::path::~path((path *)&local_150);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Input directory doesn\'t exist!");
LAB_00109733:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void run() {
        if (!recursive) {
            return run_once();
        }

        if (!fs::exists(input_dir) || !fs::is_directory(input_dir)) {
            throw std::runtime_error("Input directory doesn't exist!");
        }

        if (input_format.empty()) {
            throw std::runtime_error("Recursive run needs input format!");
        }

        auto const format = get_format(input_format, "", "");
        if (!format) {
            throw std::runtime_error("No format found for recursive run!");
        }

        auto const extension = format->default_extension();
        if (format->default_extension().empty()) {
            throw std::runtime_error("Format must have default extension!");
        }

        for (auto const& entry: fs::recursive_directory_iterator(input_dir)) {
            if (!entry.is_regular_file()) {
                continue;
            }
            auto const path = entry.path();
            if (path.extension() != extension) {
                continue;
            }
            this->input_file = path.generic_string();
            Args {*this}.run_once();
        }
    }